

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O3

void __thiscall
btSoftColliders::CollideVF_SS::Process(CollideVF_SS *this,btDbvtNode *lnode,btDbvtNode *lface)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  btVector3 *pbVar3;
  int *piVar4;
  undefined8 uVar5;
  Node *pNVar6;
  Face *pFVar7;
  long lVar8;
  long lVar9;
  btSoftBody *pbVar10;
  SContact *pSVar11;
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  uint uVar19;
  SContact *pSVar20;
  long lVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar52 [16];
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  float local_188;
  
  pNVar6 = (Node *)(lnode->field_2).childs[0];
  pFVar7 = (Face *)(lface->field_2).childs[0];
  fVar37 = (pNVar6->m_x).m_floats[2];
  lVar21 = *(long *)((btVector3 *)pFVar7->m_n)->m_floats;
  lVar8 = *(long *)(((btVector3 *)pFVar7->m_n)->m_floats + 2);
  fVar59 = *(float *)(lVar21 + 0x18) - fVar37;
  fVar41 = *(float *)(lVar8 + 0x18) - fVar37;
  lVar9 = *(long *)((btVector3 *)pFVar7->m_n + 1);
  uVar5 = *(undefined8 *)(pNVar6->m_x).m_floats;
  fVar57 = (float)uVar5;
  fVar58 = (float)((ulong)uVar5 >> 0x20);
  fVar54 = (float)*(undefined8 *)(lVar8 + 0x10);
  fVar50 = (float)((ulong)*(undefined8 *)(lVar8 + 0x10) >> 0x20);
  fVar43 = fVar54 - fVar57;
  fVar46 = fVar50 - fVar58;
  fVar24 = (float)*(undefined8 *)(lVar9 + 0x10);
  fVar25 = (float)((ulong)*(undefined8 *)(lVar9 + 0x10) >> 0x20);
  fVar33 = (float)*(undefined8 *)(lVar21 + 0x10);
  fVar55 = (float)((ulong)*(undefined8 *)(lVar21 + 0x10) >> 0x20);
  fVar31 = fVar33 - fVar57;
  fVar34 = fVar55 - fVar58;
  fVar38 = fVar24 - fVar57;
  fVar40 = fVar25 - fVar58;
  fVar35 = *(float *)(lVar9 + 0x18) - fVar37;
  fVar44 = fVar43 - fVar31;
  fVar47 = fVar46 - fVar34;
  fVar42 = fVar41 - fVar59;
  fVar56 = fVar47 * (fVar35 - fVar59) - (fVar40 - fVar34) * fVar42;
  fVar61 = fVar42 * (fVar38 - fVar31) - (fVar35 - fVar59) * fVar44;
  fVar23 = fVar44 * (fVar40 - fVar34) - (fVar38 - fVar31) * fVar47;
  fVar26 = fVar23 * fVar23 + fVar56 * fVar56 + fVar61 * fVar61;
  if (fVar26 <= 1.1920929e-07) {
    fVar26 = 3.4028235e+38;
  }
  else {
    local_198._4_4_ = fVar47;
    local_198._0_4_ = fVar44;
    _fStack_190 = 0;
    fVar60 = 1.0 / SQRT(fVar26);
    fVar27 = fVar59 * fVar60 * fVar23 + fVar31 * fVar56 * fVar60 + fVar34 * fVar61 * fVar60;
    fVar26 = 3.4028235e+38;
    if (fVar27 * fVar27 < 3.4028235e+38) {
      fVar39 = fVar56 * fVar60 * fVar27;
      fVar53 = fVar61 * fVar60 * fVar27;
      local_188 = fVar60 * fVar23 * fVar27;
      fVar32 = fVar31 - fVar39;
      fVar60 = fVar34 - fVar53;
      fVar48 = fVar59 - local_188;
      fVar36 = fVar43 - fVar39;
      fVar45 = fVar46 - fVar53;
      fVar26 = fVar41 - local_188;
      if (0.0 < (fVar32 * fVar45 - fVar36 * fVar60) * fVar23 +
                (fVar60 * fVar26 - fVar45 * fVar48) * fVar56 +
                (fVar48 * fVar36 - fVar26 * fVar32) * fVar61) {
        fVar49 = fVar38 - fVar39;
        fVar30 = fVar40 - fVar53;
        fVar51 = fVar35 - local_188;
        if ((0.0 < (fVar36 * fVar30 - fVar49 * fVar45) * fVar23 +
                   (fVar45 * fVar51 - fVar30 * fVar26) * fVar56 +
                   (fVar26 * fVar49 - fVar51 * fVar36) * fVar61) &&
           (0.0 < (fVar49 * fVar60 - fVar32 * fVar30) * fVar23 +
                  (fVar30 * fVar48 - fVar60 * fVar51) * fVar56 +
                  fVar61 * (fVar51 * fVar32 - fVar48 * fVar49))) {
          local_198._4_4_ = fVar53;
          local_198._0_4_ = fVar39;
          fStack_190 = fVar47;
          fStack_18c = 0.0;
          fVar26 = fVar27 * fVar27;
          goto LAB_001e55d7;
        }
      }
      fStack_190 = 0.0;
      fStack_18c = 0.0;
      fVar23 = fVar42 * fVar42 + fVar44 * fVar44 + fVar47 * fVar47;
      local_188 = fVar34;
      if (fVar23 <= 1.1920929e-07) {
        fVar26 = 3.4028235e+38;
      }
      else {
        fVar23 = -(fVar59 * fVar42 + fVar31 * fVar44 + fVar34 * fVar47) / fVar23;
        fVar26 = 1.0;
        if (fVar23 <= 1.0) {
          fVar26 = fVar23;
        }
        fVar26 = (float)(~-(uint)(fVar23 < 0.0) & (uint)fVar26);
        fVar44 = fVar44 * fVar26 + fVar31;
        fVar47 = fVar47 * fVar26 + fVar34;
        fStack_190 = fVar26 * 0.0 + 0.0;
        fStack_18c = fVar26 * 0.0 + 0.0;
        fVar23 = fVar26 * fVar42 + fVar59;
        fVar42 = fVar23 * fVar23 + fVar44 * fVar44 + fVar47 * fVar47;
        fVar26 = 3.4028235e+38;
        if (fVar42 < 3.4028235e+38) {
          fVar26 = fVar42;
          local_188 = fVar23;
        }
      }
      fVar23 = fVar38 - fVar43;
      fVar42 = fVar40 - fVar46;
      fVar61 = fVar35 - fVar41;
      fVar56 = fVar61 * fVar61 + fVar23 * fVar23 + fVar42 * fVar42;
      if (1.1920929e-07 < fVar56) {
        fVar56 = -(fVar41 * fVar61 + fVar23 * fVar43 + fVar42 * fVar46) / fVar56;
        fVar27 = 1.0;
        if (fVar56 <= 1.0) {
          fVar27 = fVar56;
        }
        fVar27 = (float)(~-(uint)(fVar56 < 0.0) & (uint)fVar27);
        fVar43 = fVar27 * fVar23 + fVar43;
        fVar46 = fVar27 * fVar42 + fVar46;
        fVar41 = fVar27 * fVar61 + fVar41;
        fVar23 = fVar41 * fVar41 + fVar43 * fVar43 + fVar46 * fVar46;
        if (fVar23 < fVar26) {
          fVar44 = fVar43;
          fVar47 = fVar46;
          fStack_190 = fVar27 * 0.0 + 0.0;
          fStack_18c = fVar27 * 0.0 + 0.0;
          fVar26 = fVar23;
          local_188 = fVar41;
        }
      }
      local_198._4_4_ = fVar47;
      local_198._0_4_ = fVar44;
      fVar31 = fVar31 - fVar38;
      fVar34 = fVar34 - fVar40;
      fVar59 = fVar59 - fVar35;
      fVar44 = fVar59 * fVar59 + fVar31 * fVar31 + fVar34 * fVar34;
      if (1.1920929e-07 < fVar44) {
        fVar44 = -(fVar35 * fVar59 + fVar38 * fVar31 + fVar40 * fVar34) / fVar44;
        fVar47 = 1.0;
        if (fVar44 <= 1.0) {
          fVar47 = fVar44;
        }
        fVar47 = (float)(~-(uint)(fVar44 < 0.0) & (uint)fVar47);
        fVar38 = fVar38 + fVar47 * fVar31;
        fVar40 = fVar40 + fVar47 * fVar34;
        fVar35 = fVar47 * fVar59 + fVar35;
        fVar44 = fVar35 * fVar35 + fVar38 * fVar38 + fVar40 * fVar40;
        if (fVar44 < fVar26) {
          local_198._4_4_ = fVar40;
          local_198._0_4_ = fVar38;
          fStack_190 = fVar47 * 0.0 + 0.0;
          fStack_18c = fVar47 * 0.0 + 0.0;
          fVar26 = fVar44;
          local_188 = fVar35;
        }
      }
    }
  }
LAB_001e55d7:
  fVar47 = fVar57 - (pNVar6->m_q).m_floats[0];
  fVar44 = fVar58 - *(float *)((long)(pNVar6->m_q).m_floats + 4);
  fVar23 = fVar37 - *(float *)((long)(pNVar6->m_q).m_floats + 8);
  fVar44 = SQRT(fVar23 * fVar23 + fVar47 * fVar47 + fVar44 * fVar44);
  fVar44 = fVar44 + fVar44 + this->mrg;
  if (fVar26 < fVar44 * fVar44) {
    fVar37 = fVar37 + local_188;
    fVar57 = fVar57 + (float)local_198._0_4_;
    fVar58 = fVar58 + (float)local_198._4_4_;
    fStack_190 = fStack_190 + 0.0;
    fStack_18c = fStack_18c + 0.0;
    fVar33 = fVar33 - fVar57;
    fVar54 = fVar54 - fVar57;
    fVar55 = fVar55 - fVar58;
    fVar31 = *(float *)(lVar21 + 0x18) - fVar37;
    fVar50 = fVar50 - fVar58;
    fVar34 = *(float *)(lVar9 + 0x18) - fVar37;
    fVar42 = *(float *)(lVar8 + 0x18) - fVar37;
    fVar35 = fVar55 * fVar42 - fVar50 * fVar31;
    fVar23 = fVar31 * fVar54 - fVar42 * fVar33;
    fVar47 = fVar50 * fVar33 - fVar54 * fVar55;
    fVar40 = SQRT(fVar47 * fVar47 + fVar35 * fVar35 + fVar23 * fVar23);
    fVar24 = fVar24 - fVar57;
    fVar25 = fVar25 - fVar58;
    fVar57 = 0.0 - fStack_190;
    fVar23 = 0.0 - fStack_18c;
    fVar35 = fVar25 * fVar31 - fVar55 * fVar34;
    fVar58 = fVar34 * fVar50 - fVar25 * fVar42;
    fVar43 = fVar57 * (0.0 - fStack_190) - (0.0 - fStack_190) * (0.0 - fVar37);
    fVar46 = fVar23 * (0.0 - fStack_18c) - (0.0 - fStack_18c) * (0.0 - fVar37);
    fVar31 = fVar34 * fVar33 - fVar31 * fVar24;
    fVar34 = fVar24 * fVar42 - fVar34 * fVar54;
    fVar38 = fVar57 * (0.0 - fStack_190) - (0.0 - fStack_190) * fVar57;
    fVar41 = fVar23 * (0.0 - fStack_18c) - (0.0 - fStack_18c) * fVar23;
    fVar37 = fVar24 * fVar55 - fVar33 * fVar25;
    fVar47 = fVar25 * fVar54 - fVar24 * fVar50;
    fVar57 = fVar57 * (0.0 - fStack_190) - fVar42 * fVar57;
    fVar23 = fVar23 * (0.0 - fStack_18c) - fVar25 * fVar23;
    auVar28._0_4_ = fVar35 * fVar35 + fVar31 * fVar31;
    auVar28._4_4_ = fVar58 * fVar58 + fVar34 * fVar34;
    auVar28._8_4_ = fVar43 * fVar43 + fVar38 * fVar38;
    auVar28._12_4_ = fVar46 * fVar46 + fVar41 * fVar41;
    auVar29._4_4_ = fVar47 * fVar47 + auVar28._4_4_;
    auVar29._0_4_ = fVar37 * fVar37 + auVar28._0_4_;
    auVar29._8_4_ = fVar57 * fVar57 + auVar28._8_4_;
    auVar29._12_4_ = fVar23 * fVar23 + auVar28._12_4_;
    auVar29 = sqrtps(auVar28,auVar29);
    fVar47 = 1.0 / (auVar29._4_4_ + fVar40 + auVar29._0_4_);
    fVar40 = fVar40 * fVar47;
    fVar57 = fVar47 * auVar29._0_4_;
    fVar47 = fVar47 * auVar29._4_4_;
    fVar37 = (&pNVar6->m_v)[3].m_floats[0];
    if (0.0 < *(float *)(lVar8 + 0x60) && 0.0 < *(float *)(lVar21 + 0x60)) {
      fVar23 = (float)(-(uint)(0.0 < *(float *)(lVar9 + 0x60)) &
                      (uint)(*(float *)(lVar9 + 0x60) * fVar40 +
                            *(float *)(lVar21 + 0x60) * fVar47 + *(float *)(lVar8 + 0x60) * fVar57))
      ;
    }
    else {
      fVar23 = 0.0;
    }
    fVar35 = fVar37 + fVar23;
    if (0.0 < fVar35) {
      if (fVar26 < 0.0) {
        fVar26 = sqrtf(fVar26);
      }
      else {
        fVar26 = SQRT(fVar26);
      }
      fVar26 = -1.0 / fVar26;
      pbVar10 = this->psb[0];
      fVar58 = (pbVar10->m_cfg).kDF;
      fVar24 = (this->psb[1]->m_cfg).kDF;
      if (fVar58 <= fVar24) {
        fVar58 = fVar24;
      }
      auVar52._4_4_ = fVar23;
      auVar52._0_4_ = fVar37;
      auVar52._8_8_ = 0;
      auVar12._4_4_ = fVar35;
      auVar12._0_4_ = fVar35;
      auVar12._8_4_ = fVar35;
      auVar12._12_4_ = fVar35;
      auVar29 = divps(auVar52,auVar12);
      fVar37 = (this->psb[1]->m_cfg).kSHR;
      fVar23 = (pbVar10->m_cfg).kSHR;
      uVar19 = (pbVar10->m_scontacts).m_size;
      if (uVar19 == (pbVar10->m_scontacts).m_capacity) {
        iVar22 = 1;
        if (uVar19 != 0) {
          iVar22 = uVar19 * 2;
        }
        if ((int)uVar19 < iVar22) {
          if (iVar22 == 0) {
            pSVar20 = (SContact *)0x0;
          }
          else {
            pSVar20 = (SContact *)btAlignedAllocInternal((long)iVar22 << 6,0x10);
            uVar19 = (pbVar10->m_scontacts).m_size;
          }
          if (0 < (int)uVar19) {
            lVar21 = 0;
            do {
              pSVar11 = (pbVar10->m_scontacts).m_data;
              puVar1 = (undefined8 *)
                       ((long)&((SContact *)(&pSVar11->m_weights + -1))->m_node + lVar21);
              uVar5 = *puVar1;
              uVar13 = puVar1[1];
              puVar1 = (undefined8 *)((long)(pSVar11->m_weights).m_floats + lVar21);
              uVar14 = *puVar1;
              uVar15 = puVar1[1];
              puVar1 = (undefined8 *)((long)(pSVar11->m_normal).m_floats + lVar21);
              uVar16 = *puVar1;
              uVar17 = puVar1[1];
              puVar1 = (undefined8 *)((long)pSVar11->m_cfm + lVar21 + -8);
              uVar18 = puVar1[1];
              puVar2 = (undefined8 *)((long)pSVar20->m_cfm + lVar21 + -8);
              *puVar2 = *puVar1;
              puVar2[1] = uVar18;
              puVar1 = (undefined8 *)((long)(pSVar20->m_normal).m_floats + lVar21);
              *puVar1 = uVar16;
              puVar1[1] = uVar17;
              puVar1 = (undefined8 *)((long)(pSVar20->m_weights).m_floats + lVar21);
              *puVar1 = uVar14;
              puVar1[1] = uVar15;
              puVar1 = (undefined8 *)
                       ((long)&((SContact *)(&pSVar20->m_weights + -1))->m_node + lVar21);
              *puVar1 = uVar5;
              puVar1[1] = uVar13;
              lVar21 = lVar21 + 0x40;
            } while ((ulong)uVar19 << 6 != lVar21);
          }
          pSVar11 = (pbVar10->m_scontacts).m_data;
          if ((pSVar11 != (SContact *)0x0) && ((pbVar10->m_scontacts).m_ownsMemory == true)) {
            btAlignedFreeInternal(pSVar11);
          }
          (pbVar10->m_scontacts).m_ownsMemory = true;
          (pbVar10->m_scontacts).m_data = pSVar20;
          (pbVar10->m_scontacts).m_capacity = iVar22;
          uVar19 = (pbVar10->m_scontacts).m_size;
        }
      }
      pSVar20 = (pbVar10->m_scontacts).m_data;
      pSVar20[(int)uVar19].m_node = pNVar6;
      pSVar20[(int)uVar19].m_face = pFVar7;
      pbVar3 = &pSVar20[(int)uVar19].m_weights;
      pbVar3->m_floats[0] = fVar47;
      pbVar3->m_floats[1] = fVar57;
      pbVar3->m_floats[2] = fVar40;
      pbVar3->m_floats[3] = 0.0;
      pbVar3 = &pSVar20[(int)uVar19].m_normal;
      pbVar3->m_floats[0] = (float)local_198._0_4_ * fVar26;
      pbVar3->m_floats[1] = (float)local_198._4_4_ * fVar26;
      pbVar3->m_floats[2] = local_188 * fVar26;
      pbVar3->m_floats[3] = 0.0;
      pSVar20[(int)uVar19].m_margin = fVar44;
      pSVar20[(int)uVar19].m_friction = fVar58;
      *(ulong *)pSVar20[(int)uVar19].m_cfm = CONCAT44(fVar37 * auVar29._4_4_,fVar23 * auVar29._0_4_)
      ;
      piVar4 = &(pbVar10->m_scontacts).m_size;
      *piVar4 = *piVar4 + 1;
    }
  }
  return;
}

Assistant:

void		Process(const btDbvtNode* lnode,
			const btDbvtNode* lface)
		{
			btSoftBody::Node*	node=(btSoftBody::Node*)lnode->data;
			btSoftBody::Face*	face=(btSoftBody::Face*)lface->data;
			btVector3			o=node->m_x;
			btVector3			p;
			btScalar			d=SIMD_INFINITY;
			ProjectOrigin(	face->m_n[0]->m_x-o,
				face->m_n[1]->m_x-o,
				face->m_n[2]->m_x-o,
				p,d);
			const btScalar	m=mrg+(o-node->m_q).length()*2;
			if(d<(m*m))
			{
				const btSoftBody::Node*	n[]={face->m_n[0],face->m_n[1],face->m_n[2]};
				const btVector3			w=BaryCoord(n[0]->m_x,n[1]->m_x,n[2]->m_x,p+o);
				const btScalar			ma=node->m_im;
				btScalar				mb=BaryEval(n[0]->m_im,n[1]->m_im,n[2]->m_im,w);
				if(	(n[0]->m_im<=0)||
					(n[1]->m_im<=0)||
					(n[2]->m_im<=0))
				{
					mb=0;
				}
				const btScalar	ms=ma+mb;
				if(ms>0)
				{
					btSoftBody::SContact	c;
					c.m_normal		=	p/-btSqrt(d);
					c.m_margin		=	m;
					c.m_node		=	node;
					c.m_face		=	face;
					c.m_weights		=	w;
					c.m_friction	=	btMax(psb[0]->m_cfg.kDF,psb[1]->m_cfg.kDF);
					c.m_cfm[0]		=	ma/ms*psb[0]->m_cfg.kSHR;
					c.m_cfm[1]		=	mb/ms*psb[1]->m_cfg.kSHR;
					psb[0]->m_scontacts.push_back(c);
				}
			}	
		}